

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O1

int hdr_log_write_entry(hdr_log_writer *writer,FILE *file,hdr_log_entry *entry,
                       hdr_histogram *histogram)

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  size_t output_len;
  char *output;
  int64_t iVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  uint8_t *compressed_histogram;
  double local_50;
  double local_48;
  char *local_40;
  size_t compressed_len;
  
  output = (char *)0x0;
  compressed_histogram = (uint8_t *)0x0;
  compressed_len = 0;
  uVar2 = hdr_encode_compressed(histogram,&compressed_histogram,&compressed_len);
  sVar1 = compressed_len;
  if (uVar2 == 0) {
    output_len = hdr_base64_encoded_len(compressed_len);
    output = (char *)calloc(output_len + 1,1);
    uVar2 = hdr_base64_encode(compressed_histogram,sVar1,output,output_len);
    if (uVar2 == 0) {
      local_40 = entry->tag;
      if (local_40 == (char *)0x0) {
        bVar7 = false;
      }
      else {
        bVar7 = entry->tag_len != 0;
      }
      pcVar5 = "Tag=";
      if (!bVar7) {
        pcVar5 = "";
      }
      pcVar6 = ",";
      if (!bVar7) {
        pcVar6 = "";
        local_40 = "";
      }
      sVar1 = entry->tag_len;
      local_48 = hdr_timespec_as_double(&entry->start_timestamp);
      local_50 = hdr_timespec_as_double(&entry->interval);
      iVar4 = hdr_max(histogram);
      iVar3 = fprintf((FILE *)file,"%s%.*s%s%.3f,%.3f,%lu.0,%s\n",local_48,local_50,pcVar5,
                      (ulong)(uint)sVar1,local_40,pcVar6,iVar4,output);
      uVar2 = iVar3 >> 0x1f & 5;
    }
  }
  free(compressed_histogram);
  free(output);
  return uVar2;
}

Assistant:

int hdr_log_write_entry(
    struct hdr_log_writer* writer,
    FILE* file,
    struct hdr_log_entry* entry,
    struct hdr_histogram* histogram)
{
    uint8_t* compressed_histogram = NULL;
    size_t compressed_len = 0;
    char* encoded_histogram = NULL;
    int rc = 0;
    int result = 0;
    size_t encoded_len;
    int has_tag = 0;
    const char* tag_prefix;
    const char* tag_value;
    const char* tag_separator;

    (void)writer;

    rc = hdr_encode_compressed(histogram, &compressed_histogram, &compressed_len);
    if (rc != 0)
    {
        FAIL_AND_CLEANUP(cleanup, result, rc);
    }

    encoded_len = hdr_base64_encoded_len(compressed_len);
    encoded_histogram = (char*) hdr_calloc(encoded_len + 1, sizeof(char));

    rc = hdr_base64_encode(
        compressed_histogram, compressed_len, encoded_histogram, encoded_len);
    if (rc != 0)
    {
        FAIL_AND_CLEANUP(cleanup, result, rc);
    }

    has_tag = NULL != entry->tag && 0 < entry->tag_len;
    tag_prefix = has_tag ? "Tag=" : "";
    tag_value = has_tag ? entry->tag : "";
    tag_separator = has_tag ? "," : "";

    if (fprintf(
        file, "%s%.*s%s%.3f,%.3f,%" PRIu64 ".0,%s\n",
        tag_prefix, (int) entry->tag_len, tag_value, tag_separator,
        hdr_timespec_as_double(&entry->start_timestamp),
        hdr_timespec_as_double(&entry->interval),
        hdr_max(histogram),
        encoded_histogram) < 0)
    {
        result = EIO;
    }

    cleanup:
    hdr_free(compressed_histogram);
    hdr_free(encoded_histogram);

    return result;
}